

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectileMotion.cpp
# Opt level: O0

double calculateGravity(vector<BoxPoint,_std::allocator<BoxPoint>_> *points)

{
  double dVar1;
  double dVar2;
  size_type sVar3;
  reference pvVar4;
  iterator __first;
  iterator __last;
  undefined1 auVar5 [16];
  double local_c0;
  double local_b8;
  double v2;
  double v1;
  BoxPoint last;
  BoxPoint next;
  BoxPoint cur;
  ulong local_40;
  size_t i;
  undefined1 local_28 [8];
  vector<double,_std::allocator<double>_> gravities;
  vector<BoxPoint,_std::allocator<BoxPoint>_> *points_local;
  
  gravities.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)points;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_28);
  sVar3 = std::vector<BoxPoint,_std::allocator<BoxPoint>_>::size(points);
  std::vector<double,_std::allocator<double>_>::reserve
            ((vector<double,_std::allocator<double>_> *)local_28,sVar3 - 2);
  local_40 = 0;
  while( true ) {
    sVar3 = std::vector<BoxPoint,_std::allocator<BoxPoint>_>::size(points);
    if (sVar3 - 2 <= local_40) break;
    pvVar4 = std::vector<BoxPoint,_std::allocator<BoxPoint>_>::at(points,local_40);
    dVar1 = pvVar4->z;
    pvVar4 = std::vector<BoxPoint,_std::allocator<BoxPoint>_>::at(points,local_40 + 1);
    last.z = pvVar4->x;
    dVar2 = pvVar4->z;
    pvVar4 = std::vector<BoxPoint,_std::allocator<BoxPoint>_>::at(points,local_40 + 2);
    v1 = pvVar4->x;
    last.x = pvVar4->yHeight;
    last.yHeight = pvVar4->yWidth;
    last.yWidth = pvVar4->z;
    v2 = dVar2 - dVar1;
    local_b8 = last.yWidth - dVar2;
    local_c0 = local_b8 - v2;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              ((vector<double,_std::allocator<double>_> *)local_28,&local_c0);
    local_40 = local_40 + 1;
  }
  __first = std::vector<double,_std::allocator<double>_>::begin
                      ((vector<double,_std::allocator<double>_> *)local_28);
  __last = std::vector<double,_std::allocator<double>_>::end
                     ((vector<double,_std::allocator<double>_> *)local_28);
  dVar1 = std::
          accumulate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                    ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     __first._M_current,
                     (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     __last._M_current,0.0);
  sVar3 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)local_28);
  auVar5._8_4_ = (int)(sVar3 >> 0x20);
  auVar5._0_8_ = sVar3;
  auVar5._12_4_ = 0x45300000;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_28);
  return dVar1 / ((auVar5._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0));
}

Assistant:

double calculateGravity(std::vector<BoxPoint> points){
    // estimates acceleration of gravityusing the trajectory of the given points
    std::vector<double> gravities;
    gravities.reserve(points.size() - 2);
    for(size_t i=0; i<points.size()-2; i++){
        BoxPoint cur = points.at(i);
        BoxPoint next = points.at(i+1);
        BoxPoint last = points.at(i+2);

        // find v2, v1, g = v2-v1/deltat, deltat=1
        double v1 = next.z - cur.z;
        double v2 = last.z - next.z;
        gravities.emplace_back(v2-v1);

    }
    return std::accumulate(gravities.begin(), gravities.end(), 0.0)/gravities.size();
}